

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadBlif.c
# Opt level: O2

void Prs_ManReadBlifTest(char *pFileName)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  abctime aVar13;
  Vec_Ptr_t *vPrs;
  Abc_Nam_t *pAVar14;
  void *pvVar15;
  abctime aVar16;
  char *pFileName_00;
  int iVar17;
  int iVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  aVar13 = Abc_Clock();
  vPrs = Prs_ManReadBlif(pFileName);
  if (vPrs != (Vec_Ptr_t *)0x0) {
    printf("Finished reading %d networks. ",(ulong)(uint)vPrs->nSize);
    pAVar14 = Prs_ManNameMan(vPrs);
    uVar12 = Abc_NamObjNumMax(pAVar14);
    printf("NameIDs = %d. ",(ulong)uVar12);
    iVar17 = vPrs->nCap;
    auVar20._8_4_ = iVar17 >> 0x1f;
    auVar20._0_8_ = (long)iVar17;
    auVar20._12_4_ = 0x45300000;
    iVar19 = (int)(((auVar20._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,iVar17) - 4503599627370496.0)) * 8.0 + 16.0);
    for (iVar17 = 0; iVar17 < vPrs->nSize; iVar17 = iVar17 + 1) {
      pvVar15 = Vec_PtrEntry(vPrs,iVar17);
      iVar18 = *(int *)((long)pvVar15 + 0x20);
      auVar21._8_4_ = iVar18 >> 0x1f;
      auVar21._0_8_ = (long)iVar18;
      auVar21._12_4_ = 0x45300000;
      iVar1 = *(int *)((long)pvVar15 + 0x30);
      auVar22._8_4_ = iVar1 >> 0x1f;
      auVar22._0_8_ = (long)iVar1;
      auVar22._12_4_ = 0x45300000;
      iVar2 = *(int *)((long)pvVar15 + 0x40);
      auVar23._8_4_ = iVar2 >> 0x1f;
      auVar23._0_8_ = (long)iVar2;
      auVar23._12_4_ = 0x45300000;
      iVar3 = *(int *)((long)pvVar15 + 0x50);
      auVar24._8_4_ = iVar3 >> 0x1f;
      auVar24._0_8_ = (long)iVar3;
      auVar24._12_4_ = 0x45300000;
      iVar4 = *(int *)((long)pvVar15 + 0x60);
      auVar25._8_4_ = iVar4 >> 0x1f;
      auVar25._0_8_ = (long)iVar4;
      auVar25._12_4_ = 0x45300000;
      iVar5 = *(int *)((long)pvVar15 + 0x70);
      auVar26._8_4_ = iVar5 >> 0x1f;
      auVar26._0_8_ = (long)iVar5;
      auVar26._12_4_ = 0x45300000;
      iVar6 = *(int *)((long)pvVar15 + 0x80);
      auVar27._8_4_ = iVar6 >> 0x1f;
      auVar27._0_8_ = (long)iVar6;
      auVar27._12_4_ = 0x45300000;
      iVar7 = *(int *)((long)pvVar15 + 0x90);
      auVar28._8_4_ = iVar7 >> 0x1f;
      auVar28._0_8_ = (long)iVar7;
      auVar28._12_4_ = 0x45300000;
      iVar8 = *(int *)((long)pvVar15 + 0xa0);
      auVar29._8_4_ = iVar8 >> 0x1f;
      auVar29._0_8_ = (long)iVar8;
      auVar29._12_4_ = 0x45300000;
      iVar9 = *(int *)((long)pvVar15 + 0xb0);
      auVar30._8_4_ = iVar9 >> 0x1f;
      auVar30._0_8_ = (long)iVar9;
      auVar30._12_4_ = 0x45300000;
      iVar10 = *(int *)((long)pvVar15 + 0xd0);
      auVar31._8_4_ = iVar10 >> 0x1f;
      auVar31._0_8_ = (long)iVar10;
      auVar31._12_4_ = 0x45300000;
      iVar11 = *(int *)((long)pvVar15 + 0xc0);
      auVar32._8_4_ = iVar11 >> 0x1f;
      auVar32._0_8_ = (long)iVar11;
      auVar32._12_4_ = 0x45300000;
      iVar19 = iVar19 + (int)((double)(int)((double)(int)((double)(int)((double)(int)((double)(int)(
                                                  (double)(int)((double)(int)((double)(int)((double)
                                                  (int)((double)(int)((double)(int)(((auVar21._8_8_
                                                                                     - 
                                                  1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,iVar18) -
                                                  4503599627370496.0)) * 4.0 + 16.0 + 240.0) +
                                                  ((auVar22._8_8_ - 1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,iVar1) -
                                                  4503599627370496.0)) * 4.0 + 16.0) +
                                                  ((auVar23._8_8_ - 1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,iVar2) -
                                                  4503599627370496.0)) * 4.0 + 16.0) +
                                                  ((auVar24._8_8_ - 1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,iVar3) -
                                                  4503599627370496.0)) * 4.0 + 16.0) +
                                                  ((auVar25._8_8_ - 1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,iVar4) -
                                                  4503599627370496.0)) * 4.0 + 16.0) +
                                                  ((auVar26._8_8_ - 1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,iVar5) -
                                                  4503599627370496.0)) * 4.0 + 16.0) +
                                                  ((auVar27._8_8_ - 1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,iVar6) -
                                                  4503599627370496.0)) * 4.0 + 16.0) +
                                                  ((auVar28._8_8_ - 1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,iVar7) -
                                                  4503599627370496.0)) * 4.0 + 16.0) +
                                                  ((auVar29._8_8_ - 1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,iVar8) -
                                                  4503599627370496.0)) * 4.0 + 16.0) +
                                                  ((auVar30._8_8_ - 1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,iVar9) -
                                                  4503599627370496.0)) * 4.0 + 16.0) +
                                           ((auVar31._8_8_ - 1.9342813113834067e+25) +
                                           ((double)CONCAT44(0x43300000,iVar10) - 4503599627370496.0
                                           )) * 4.0 + 16.0) +
                             ((auVar32._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,iVar11) - 4503599627370496.0)) * 4.0 +
                             16.0);
    }
    pAVar14 = Prs_ManNameMan(vPrs);
    iVar17 = Abc_NamMemUsed(pAVar14);
    iVar18 = 0x7a311f;
    printf("Memory = %.2f MB. ",(double)(iVar17 + iVar19) * 9.5367431640625e-07);
    aVar16 = Abc_Clock();
    Abc_Print(iVar18,"%s =","Time");
    Abc_Print(iVar18,"%9.2f sec\n",(double)(aVar16 - aVar13) / 1000000.0);
    pFileName_00 = Extra_FileNameGenericAppend(pFileName,"_out.blif");
    Prs_ManWriteBlif(pFileName_00,vPrs);
    Prs_ManVecFree(vPrs);
    return;
  }
  return;
}

Assistant:

void Prs_ManReadBlifTest( char * pFileName )
{
    abctime clk = Abc_Clock();
    Vec_Ptr_t * vPrs = Prs_ManReadBlif( pFileName );
    if ( !vPrs ) return;
    printf( "Finished reading %d networks. ", Vec_PtrSize(vPrs) );
    printf( "NameIDs = %d. ", Abc_NamObjNumMax(Prs_ManNameMan(vPrs)) );
    printf( "Memory = %.2f MB. ", 1.0*Prs_ManMemory(vPrs)/(1<<20) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//    Abc_NamPrint( p->pStrs );
    Prs_ManWriteBlif( Extra_FileNameGenericAppend(pFileName, "_out.blif"), vPrs );
    Prs_ManVecFree( vPrs );
}